

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDTestBase<3U,_3U>::createDFDTestBase
          (createDFDTestBase<3U,_3U> *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__createDFDTestBase_00217ed8;
  in_RDI[2] = in_RDI[2] & 0xfffffffffffe0000;
  in_RDI[2] = in_RDI[2] & 0xffffffff0001ffff;
  in_RDI[2] = in_RDI[2] & 0xffff0000ffffffff | 0x200000000;
  in_RDI[2] = in_RDI[2] & 0xffffffffffff | 0x48000000000000;
  in_RDI[4] = in_RDI[4] & 0xffffffffffffff00 | 3;
  in_RDI[4] = in_RDI[4] & 0xffffffffffff00ff;
  in_RDI[4] = in_RDI[4] & 0xffffffffff00ffff;
  in_RDI[4] = in_RDI[4] & 0xffffffff00ffffff;
  in_RDI[4] = in_RDI[4] & 0xffffff00ffffffff;
  in_RDI[4] = in_RDI[4] & 0xffff00ffffffffff;
  in_RDI[4] = in_RDI[4] & 0xff00ffffffffffff;
  in_RDI[4] = in_RDI[4] & 0xffffffffffffff;
  return;
}

Assistant:

createDFDTestBase() {
        expected.vendorId = KHR_DF_VENDORID_KHRONOS;
        expected.descriptorType = KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT;
        expected.versionNumber = KHR_DF_VERSIONNUMBER_1_3;
        // sizeof is after template instantiation so BDFD already includes
        // numComponents samples.
        expected.descriptorBlockSize = sizeof(BDFD);
        expected.bytesPlane0 = bytesPlane;
        expected.bytesPlane1 = 0;
        expected.bytesPlane2 = 0;
        expected.bytesPlane3 = 0;
        expected.bytesPlane4 = 0;
        expected.bytesPlane5 = 0;
        expected.bytesPlane6 = 0;
        expected.bytesPlane7 = 0;

    }